

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo
          (CopyPropagateArrays *this,AccessChainEntry *entry,uint32_t value)

{
  int iVar1;
  uint32_t uVar2;
  IRContext *this_00;
  ConstantManager *this_01;
  Constant *this_02;
  Type *pTVar3;
  undefined4 extraout_var;
  Constant *constant;
  ConstantManager *const_mgr;
  uint32_t value_local;
  AccessChainEntry *entry_local;
  CopyPropagateArrays *this_local;
  
  if ((entry->is_result_id & 1U) == 0) {
    this_local._7_1_ = (entry->field_1).result_id == value;
  }
  else {
    this_00 = Pass::context((Pass *)this);
    this_01 = IRContext::get_constant_mgr(this_00);
    this_02 = analysis::ConstantManager::FindDeclaredConstant(this_01,(entry->field_1).result_id);
    if (this_02 != (Constant *)0x0) {
      pTVar3 = analysis::Constant::type(this_02);
      iVar1 = (*pTVar3->_vptr_Type[10])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        uVar2 = analysis::Constant::GetU32(this_02);
        return uVar2 == value;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CopyPropagateArrays::IsAccessChainIndexValidAndEqualTo(
    const AccessChainEntry& entry, uint32_t value) const {
  if (!entry.is_result_id) {
    return entry.immediate == value;
  }

  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  const analysis::Constant* constant =
      const_mgr->FindDeclaredConstant(entry.result_id);
  if (!constant || !constant->type()->AsInteger()) {
    return false;
  }
  return constant->GetU32() == value;
}